

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitIf(Graph *this,If *curr)

{
  mapped_type pEVar1;
  mapped_type *ppEVar2;
  undefined1 local_88 [8];
  Locals afterIfFalseState;
  Locals afterIfTrueState;
  undefined1 local_48 [8];
  Locals initialState;
  Node *condition;
  mapped_type local_20;
  Expression *oldParent;
  If *curr_local;
  Graph *this_local;
  
  pEVar1 = this->parent;
  condition = (Node *)curr;
  local_20 = pEVar1;
  oldParent = (Expression *)curr;
  curr_local = (If *)this;
  ppEVar2 = std::
            unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
            ::operator[](&this->expressionParentMap,(key_type *)&condition);
  *ppEVar2 = pEVar1;
  this->parent = oldParent;
  initialState.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                          ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                           *(Expression **)(oldParent + 1));
  if ((Node *)initialState.
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (Node *)0x0) {
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_48,
               &this->locals);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
               (Expression *)oldParent[1].type.id);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               &afterIfFalseState.
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&this->locals);
    if (*(long *)(oldParent + 2) == 0) {
      mergeIf(this,(Locals *)local_48,
              (Locals *)
              &afterIfFalseState.
               super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
              (Node *)initialState.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,oldParent,&this->locals);
    }
    else {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (&this->locals,
                 (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_48
                );
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                 *(Expression **)(oldParent + 2));
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_88
                 ,&this->locals);
      mergeIf(this,(Locals *)
                   &afterIfFalseState.
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Locals *)local_88,
              (Node *)initialState.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,oldParent,&this->locals);
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::~vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_88
                );
    }
    this->parent = local_20;
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::~vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               &afterIfFalseState.
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::~vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_48);
    return &this->bad;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                ,0x10a,"Node *wasm::DataFlow::Graph::doVisitIf(If *)");
}

Assistant:

Node* doVisitIf(If* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // Set up the condition.
    Node* condition = visit(curr->condition);
    assert(condition);
    // Handle the contents.
    auto initialState = locals;
    visit(curr->ifTrue);
    auto afterIfTrueState = locals;
    if (curr->ifFalse) {
      locals = initialState;
      visit(curr->ifFalse);
      auto afterIfFalseState = locals; // TODO: optimize
      mergeIf(afterIfTrueState, afterIfFalseState, condition, curr, locals);
    } else {
      mergeIf(initialState, afterIfTrueState, condition, curr, locals);
    }
    parent = oldParent;
    return &bad;
  }